

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O1

bool MeCab::Viterbi::buildAlternative(Lattice *lattice)

{
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar8;
  long lVar7;
  
  iVar5 = (*lattice->_vptr_Lattice[4])();
  iVar6 = (*lattice->_vptr_Lattice[2])(lattice);
  for (lVar7 = CONCAT44(extraout_var_00,iVar6); lVar7 != 0; lVar7 = *(long *)(lVar7 + 8)) {
    if ((*(byte *)(lVar7 + 0x4f) & 0xfe) != 2) {
      lVar3 = *(long *)(lVar7 + 0x30);
      iVar6 = (*lattice->_vptr_Lattice[8])();
      uVar1 = *(ushort *)(lVar7 + 0x46);
      uVar2 = *(ushort *)(lVar7 + 0x44);
      std::ostream::write((char *)&std::cout,*(long *)(lVar7 + 0x30));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      pcVar4 = *(char **)(lVar7 + 0x38);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a9338);
      }
      else {
        sVar8 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar8);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
      for (lVar3 = *(long *)(CONCAT44(extraout_var,iVar5) +
                             (lVar3 - (CONCAT44(extraout_var_01,iVar6) + (ulong)uVar1)) * 8 +
                            (ulong)uVar2 * 8); lVar3 != 0; lVar3 = *(long *)(lVar3 + 0x18)) {
        if ((*(short *)(lVar3 + 0x46) == *(short *)(lVar7 + 0x46)) &&
           (*(short *)(lVar3 + 0x44) == *(short *)(lVar7 + 0x44))) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"@ ",2);
          std::ostream::write((char *)&std::cout,*(long *)(lVar3 + 0x30));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
          pcVar4 = *(char **)(lVar3 + 0x38);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a9338);
          }
          else {
            sVar8 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar8);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
          std::ostream::put('8');
          std::ostream::flush();
        }
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EOS",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return true;
}

Assistant:

bool Viterbi::buildAlternative(Lattice *lattice) {
  Node **begin_node_list = lattice->begin_nodes();

  const Node *bos_node = lattice->bos_node();
  for (const Node *node = bos_node; node; node = node->next) {
    if (node->stat == MECAB_BOS_NODE || node->stat == MECAB_EOS_NODE) {
      continue;
    }
    const size_t pos = node->surface - lattice->sentence() -
        node->rlength + node->length;
    std::cout.write(node->surface, node->length);
    std::cout << "\t" << node->feature << std::endl;
    for (const Node *anode = begin_node_list[pos];
         anode; anode = anode->bnext) {
      if (anode->rlength == node->rlength &&
          anode->length == node->length) {
        std::cout << "@ ";
        std::cout.write(anode->surface, anode->length);
        std::cout << "\t" << anode->feature << std::endl;
      }
    }
  }

  std::cout << "EOS" << std::endl;

  return true;
}